

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall
duckdb::DBConfig::SetOptionsByName(DBConfig *this,case_insensitive_map_t<Value> *values)

{
  __node_base *p_Var1;
  
  p_Var1 = &(values->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    SetOptionByName(this,(string *)(p_Var1 + 1),(Value *)(p_Var1 + 5));
  }
  return;
}

Assistant:

void DBConfig::SetOptionsByName(const case_insensitive_map_t<Value> &values) {
	for (auto &kv : values) {
		auto &name = kv.first;
		auto &value = kv.second;
		SetOptionByName(name, value);
	}
}